

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.h
# Opt level: O0

void __thiscall adios2::query::QueryComposite::Print(QueryComposite *this)

{
  bool bVar1;
  ostream *this_00;
  reference ppQVar2;
  __normal_iterator<adios2::query::QueryBase_**,_std::vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>_>
  *in_RDI;
  QueryBase *n;
  iterator __end2;
  iterator __begin2;
  vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_> *__range2;
  vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<adios2::query::QueryBase_**,_std::vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>_>
  local_18;
  __normal_iterator<adios2::query::QueryBase_**,_std::vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>_>
  *local_10;
  
  this_00 = std::operator<<((ostream *)&std::cout," Composite query");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_10 = in_RDI + 8;
  local_18._M_current =
       (QueryBase **)
       std::vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  std::vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>::end
            (in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<adios2::query::QueryBase_**,_std::vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppQVar2 = __gnu_cxx::
              __normal_iterator<adios2::query::QueryBase_**,_std::vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>_>
              ::operator*(&local_18);
    (*(*ppQVar2)->_vptr_QueryBase[3])();
    __gnu_cxx::
    __normal_iterator<adios2::query::QueryBase_**,_std::vector<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void Print()
    {
        std::cout << " Composite query" << std::endl;
        for (auto n : m_Nodes)
            n->Print();
    }